

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall detail::writer::operator()(writer *this,string *val)

{
  size_t target_size;
  ulong uVar1;
  ulong uVar2;
  size_t __n;
  void *__dest;
  unsigned_short tmp;
  undefined1 local_12 [2];
  
  uVar1 = (this->buf_).size_;
  if (uVar1 == 0) {
    uVar1 = 0;
  }
  else {
    __n = 2;
    if (uVar1 < 2) {
      __n = uVar1;
    }
    memcpy((this->buf_).data_,local_12,__n);
    uVar1 = (this->buf_).size_;
  }
  uVar2 = 2;
  if (uVar1 < 2) {
    uVar2 = uVar1;
  }
  uVar1 = uVar1 - uVar2;
  __dest = (void *)(uVar2 + (long)(this->buf_).data_);
  (this->buf_).data_ = __dest;
  (this->buf_).size_ = uVar1;
  uVar2 = val->_M_string_length;
  if (uVar1 < val->_M_string_length) {
    uVar2 = uVar1;
  }
  if (uVar2 == 0) {
    uVar2 = 0;
  }
  else {
    memcpy(__dest,(val->_M_dataplus)._M_p,uVar2);
    __dest = (this->buf_).data_;
    uVar1 = (this->buf_).size_;
    uVar2 = val->_M_string_length;
    if (uVar1 < val->_M_string_length) {
      uVar2 = uVar1;
    }
  }
  (this->buf_).data_ = (void *)((long)__dest + uVar2);
  (this->buf_).size_ = uVar1 - uVar2;
  return;
}

Assistant:

void operator()(std::string const& val) const {
        (*this)(static_cast<uint16_t>(val.size()));
        asio::buffer_copy(buf_, asio::buffer(val));
        buf_ = buf_ + val.length();
    }